

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::PartitionWorkspace(OSTEI_Writer *this)

{
  QAM *pQVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  OSTEI_HRR_Algorithm_Base *pOVar5;
  _Base_ptr p_Var6;
  OSTEI_VRR_Algorithm_Base *pOVar7;
  QAM am;
  allocator local_181;
  long local_180;
  _Rb_tree_node_base *local_178;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_170;
  undefined1 local_140 [48];
  string local_110;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar4,"// partition workspace\n");
  pOVar5 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_170,pOVar5);
  local_180 = 0;
  p_Var6 = local_170._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var6 != &local_170._M_impl.super__Rb_tree_header) {
    pQVar1 = (QAM *)(p_Var6 + 1);
    local_178 = p_Var6;
    bVar2 = QAM::operator==(pQVar1,&(((this->super_OSTEI_Writer_Base).info_)->
                                    super_GeneratorInfoBase).finalam_);
    if (!bVar2) {
      poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"double * const ");
      std::__cxx11::string::string((string *)&local_110,"",&local_181);
      ArrVarName((string *)local_140,pQVar1,&local_110);
      poVar4 = std::operator<<(poVar4,(string *)local_140);
      poVar4 = std::operator<<(poVar4," = work + (SIMINT_NSHELL_SIMD * ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,");\n");
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&local_110);
      QAM::QAM((QAM *)local_c0,pQVar1);
      iVar3 = NCART((QAM *)local_c0);
      local_180 = local_180 + iVar3;
      std::__cxx11::string::~string((string *)(local_c0 + 0x10));
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_178);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_170);
  poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,
                           "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*"
                          );
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,");\n");
  pOVar7 = OSTEI_VRR_Writer::Algo((this->super_OSTEI_Writer_Base).vrr_writer_);
  OSTEI_VRR_Algorithm_Base::GetAllAM((QAMSet *)&local_170,pOVar7);
  for (p_Var6 = local_170._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_170._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"SIMINT_DBLTYPE * const restrict ");
    pQVar1 = (QAM *)(p_Var6 + 1);
    PrimVarName_abi_cxx11_((string *)local_140,pQVar1);
    poVar4 = std::operator<<(poVar4,(string *)local_140);
    poVar4 = std::operator<<(poVar4," = primwork + ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_140);
    pOVar7 = OSTEI_VRR_Writer::Algo((this->super_OSTEI_Writer_Base).vrr_writer_);
    QAM::QAM((QAM *)local_f0,pQVar1);
    OSTEI_VRR_Algorithm_Base::GetMReq(pOVar7,(QAM *)local_f0);
    QAM::QAM((QAM *)local_60,pQVar1);
    NCART((QAM *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    std::__cxx11::string::~string((string *)(local_f0 + 0x10));
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_170);
  poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"double * const hrrwork = (double *)(primwork + ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,");\n");
  pOVar5 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::GetIntermediates((QAMSet *)&local_170,pOVar5);
  for (p_Var6 = local_170._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_170._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    QAM::QAM((QAM *)local_140,(QAM *)(p_Var6 + 1));
    poVar4 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"double * const ");
    HRRVarName_abi_cxx11_(&local_110,(QAM *)local_140);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4," = hrrwork + ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)&local_110);
    QAM::QAM((QAM *)local_90,(QAM *)local_140);
    NCART((QAM *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 0x10));
    std::__cxx11::string::~string((string *)(local_140 + 0x10));
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_170);
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
  return;
}

Assistant:

void OSTEI_Writer::PartitionWorkspace(void) const
{
    os_ << indent1 << "// partition workspace\n";
    size_t ptidx = 0;

    ////////////////////////////////////////
    // For HRR batched quartets
    ////////////////////////////////////////
    for(const auto & it : hrr_writer_.Algo().TopAM())
    {
        if(!info_.IsFinalAM(it))
        {
            os_ << indent1 << "double * const " << ArrVarName(it) << " = work + (SIMINT_NSHELL_SIMD * " << ptidx << ");\n";
            ptidx += NCART(it);
        }
    }


    ////////////////////////////////////////
    // For VRR
    ////////////////////////////////////////
    // Note: vrr_writer handles the prim arrays for s_s_s_s
    //       so we always want to run this

    if(info_.UseStack())
    {
        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            os_ << indent1 << "SIMINT_DBLTYPE " << PrimVarName(am)
                << "[" << (vrr_writer_.Algo().GetMReq(am)+1) << " * "
                << NCART(am) << "] SIMINT_ALIGN_ARRAY_DBL;\n";
        }
    }
    else
    {
        os_ << indent1 << "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*" << ptidx << ");\n";
        ptidx = 0;

        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            // add +1 fromm required m values to account for 0
            os_ << indent1 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am)
                << " = primwork + " << ptidx << ";\n";

            ptidx += (vrr_writer_.Algo().GetMReq(am)+1) * NCART(am);
        }
    }

    /////////////////////
    // HRR Intermediates

    // A temporary is needed even for the "final am" if we are doing derivatives, since
    // it will actually be an intermediate
    if(info_.UseStack())
    {
        for(auto am : hrr_writer_.Algo().GetIntermediates())
            os_ << indent1 << "double " << HRRVarName(am) << "[" << NCART(am) << "];\n";
    }
    else
    {
        os_ << indent1 << "double * const hrrwork = (double *)(primwork + " << ptidx << ");\n";
        ptidx = 0;
        for(auto am : hrr_writer_.Algo().GetIntermediates())
        {
            os_ << indent1 << "double * const " << HRRVarName(am) << " = hrrwork + " << ptidx << ";\n";
            ptidx += NCART(am);
        }
    }

    os_ << "\n\n";
}